

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int __thiscall
cmsys::SystemInformationImplementation::GetFullyQualifiedDomainName
          (SystemInformationImplementation *this,string *fqdn)

{
  bool bVar1;
  ifaddrs *piVar2;
  int iVar3;
  long lVar4;
  ifaddrs *piVar5;
  uint local_88c;
  allocator local_871;
  string local_870 [8];
  string candidate;
  size_t addrlen;
  char host [1025];
  int fam;
  ifaddrs *ifa;
  ifaddrs *ifas;
  size_t baseSize;
  char base [1025];
  int ierr;
  string *fqdn_local;
  SystemInformationImplementation *this_local;
  
  unique0x10000206 = fqdn;
  std::__cxx11::string::operator=((string *)fqdn,"localhost");
  base[0x3fc] = '\0';
  base[0x3fd] = '\0';
  base[0x3fe] = '\0';
  base[0x3ff] = '\0';
  base._1020_4_ = gethostname((char *)&baseSize,0x401);
  if (base._1020_4_ == 0) {
    ifas = (ifaddrs *)strlen((char *)&baseSize);
    std::__cxx11::string::operator=((string *)stack0xffffffffffffffe0,(char *)&baseSize);
    iVar3 = getifaddrs(&ifa);
    if (iVar3 == 0) {
      base[0x3fc] = '\0';
      base[0x3fd] = '\0';
      base[0x3fe] = '\0';
      base[0x3ff] = '\0';
      for (stack0xfffffffffffffbc0 = ifa; stack0xfffffffffffffbc0 != (ifaddrs *)0x0;
          unique0x00012000 = stack0xfffffffffffffbc0->ifa_next) {
        if (stack0xfffffffffffffbc0->ifa_addr == (sockaddr *)0x0) {
          local_88c = 0xffffffff;
        }
        else {
          local_88c = (uint)stack0xfffffffffffffbc0->ifa_addr->sa_family;
        }
        host[0x3fc] = (undefined1)local_88c;
        host[0x3fd] = local_88c._1_1_;
        host[0x3fe] = local_88c._2_1_;
        host[0x3ff] = local_88c._3_1_;
        if ((local_88c == 2) || (local_88c == 10)) {
          memset(&addrlen,0,0x401);
          candidate.field_2._8_8_ = 0x1c;
          if (host._1020_4_ == 2) {
            candidate.field_2._8_8_ = 0x10;
          }
          base._1020_4_ =
               getnameinfo((sockaddr *)stack0xfffffffffffffbc0->ifa_addr,
                           (socklen_t)candidate.field_2._8_8_,(char *)&addrlen,0x401,(char *)0x0,0,8
                          );
          if (base._1020_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_870,(char *)&addrlen,&local_871);
            std::allocator<char>::~allocator((allocator<char> *)&local_871);
            lVar4 = std::__cxx11::string::find((char *)local_870,(ulong)&baseSize);
            piVar2 = ifas;
            if ((lVar4 == -1) ||
               (piVar5 = (ifaddrs *)std::__cxx11::string::size(), piVar5 <= piVar2)) {
              bVar1 = false;
            }
            else {
              base[0x3fc] = '\0';
              base[0x3fd] = '\0';
              base[0x3fe] = '\0';
              base[0x3ff] = '\0';
              std::__cxx11::string::operator=((string *)stack0xffffffffffffffe0,local_870);
              bVar1 = true;
            }
            std::__cxx11::string::~string(local_870);
            if (bVar1) break;
          }
          else {
            base[0x3fc] = -3;
            base[0x3fd] = -1;
            base[0x3fe] = -1;
            base[0x3ff] = -1;
          }
        }
      }
      freeifaddrs(ifa);
      this_local._4_1_ = base[0x3fc];
      this_local._5_1_ = base[0x3fd];
      this_local._6_1_ = base[0x3fe];
      this_local._7_1_ = base[0x3ff];
    }
    else {
      this_local._4_4_ = -2;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int SystemInformationImplementation::GetFullyQualifiedDomainName(
      std::string &fqdn)
{
  // in the event of absolute failure return localhost.
  fqdn="localhost";

#if defined(_WIN32)
  int ierr;
  // TODO - a more robust implementation for windows, see comments
  // in unix implementation.
  WSADATA wsaData;
  WORD ver=MAKEWORD(2,0);
  ierr=WSAStartup(ver,&wsaData);
  if (ierr)
    {
    return -1;
    }

  char base[256]={'\0'};
  ierr=gethostname(base,256);
  if (ierr)
    {
    WSACleanup();
    return -2;
    }
  fqdn=base;

  HOSTENT *hent=gethostbyname(base);
  if (hent)
    {
    fqdn=hent->h_name;
    }

  WSACleanup();
  return 0;

#elif defined(KWSYS_SYSTEMINFORMATION_IMPLEMENT_FQDN)
  // gethostname typical returns an alias for loopback interface
  // we want the fully qualified domain name. Because there are
  // any number of interfaces on this system we look for the
  // first of these that contains the name returned by gethostname
  // and is longer. failing that we return gethostname and indicate
  // with a failure code. Return of a failure code is not necessarilly
  // an indication of an error. for instance gethostname may return
  // the fully qualified domain name, or there may not be one if the
  // system lives on a private network such as in the case of a cluster
  // node.

  int ierr=0;
  char base[NI_MAXHOST];
  ierr=gethostname(base,NI_MAXHOST);
  if (ierr)
    {
    return -1;
    }
  size_t baseSize=strlen(base);
  fqdn=base;

  struct ifaddrs *ifas;
  struct ifaddrs *ifa;
  ierr=getifaddrs(&ifas);
  if (ierr)
    {
    return -2;
    }

  for (ifa=ifas; ifa!=NULL; ifa=ifa->ifa_next)
    {
    int fam = ifa->ifa_addr? ifa->ifa_addr->sa_family : -1;
    if ((fam==AF_INET) || (fam==AF_INET6))
      {
      char host[NI_MAXHOST]={'\0'};

      const size_t addrlen
        = (fam==AF_INET?sizeof(struct sockaddr_in):sizeof(struct sockaddr_in6));

      ierr=getnameinfo(
            ifa->ifa_addr,
            static_cast<socklen_t>(addrlen),
            host,
            NI_MAXHOST,
            NULL,
            0,
            NI_NAMEREQD);
      if (ierr)
        {
        // don't report the failure now since we may succeed on another
        // interface. If all attempts fail then return the failure code.
        ierr=-3;
        continue;
        }

      std::string candidate=host;
      if ((candidate.find(base)!=std::string::npos) && baseSize<candidate.size())
        {
        // success, stop now.
        ierr=0;
        fqdn=candidate;
        break;
        }
      }
    }
  freeifaddrs(ifas);

  return ierr;
#else
  /* TODO: Implement on more platforms.  */
  fqdn=this->GetHostname();
  return -1;
#endif
}